

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 NavCalcPreferredRefPos(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  ImVec2 IVar13;
  
  if (((GImGui->NavDisableHighlight != false) || (GImGui->NavDisableMouseHover != true)) ||
     (pIVar4 = GImGui->NavWindow, pIVar4 == (ImGuiWindow *)0x0)) {
    fVar7 = (GImGui->IO).MousePos.x;
    fVar6 = (GImGui->IO).MousePos.y;
    goto LAB_0016d890;
  }
  iVar3 = GImGui->NavLayer;
  fVar6 = (GImGui->Style).FramePadding.x * 4.0;
  fVar7 = pIVar4->NavRectRel[iVar3].Min.x;
  fVar10 = pIVar4->NavRectRel[iVar3].Max.x - fVar7;
  if (fVar10 <= fVar6) {
    fVar6 = fVar10;
  }
  fVar10 = pIVar4->NavRectRel[iVar3].Max.y;
  fVar9 = (GImGui->Style).FramePadding.y;
  fVar12 = fVar10 - pIVar4->NavRectRel[iVar3].Min.y;
  if (fVar12 <= fVar9) {
    fVar9 = fVar12;
  }
  fVar9 = (fVar10 - fVar9) + (pIVar4->Pos).y;
  fVar10 = (GImGui->IO).DisplayVisibleMin.x;
  pIVar1 = &(GImGui->IO).DisplayVisibleMax;
  if ((fVar10 != pIVar1->x) || (NAN(fVar10) || NAN(pIVar1->x))) {
    fVar10 = (GImGui->IO).DisplayVisibleMin.y;
    pfVar2 = &(GImGui->IO).DisplayVisibleMax.y;
    if ((fVar10 == *pfVar2) && (!NAN(fVar10) && !NAN(*pfVar2))) goto LAB_0016d8a2;
    IVar11 = (GImGui->IO).DisplayVisibleMin;
    IVar13 = (GImGui->IO).DisplayVisibleMax;
  }
  else {
LAB_0016d8a2:
    IVar13 = (GImGui->IO).DisplaySize;
    IVar11.x = 0.0;
    IVar11.y = 0.0;
  }
  fVar7 = fVar6 + fVar7 + (pIVar4->Pos).x;
  fVar6 = IVar11.y;
  if ((IVar11.y <= fVar9) && (fVar6 = IVar13.y, fVar9 <= IVar13.y)) {
    fVar6 = fVar9;
  }
  if (fVar7 <= IVar13.x) {
    IVar13.x = fVar7;
  }
  uVar5 = -(uint)(fVar7 < IVar11.x);
  fVar7 = (float)(uVar5 & (uint)IVar11.x | ~uVar5 & (uint)IVar13.x);
LAB_0016d890:
  IVar8.x = (float)(int)fVar7;
  IVar8.y = (float)(int)fVar6;
  return IVar8;
}

Assistant:

static ImVec2 NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
        return ImFloor(g.IO.MousePos);

    // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item
    const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
    ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x*4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
    ImRect visible_rect = GetViewportRect();
    return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
}